

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_classifier.cpp
# Opt level: O2

istream * operator>>(istream *s,Am_Gesture_Classifier *cl)

{
  Am_Gesture_Classifier *pAVar1;
  int iVar2;
  long *plVar3;
  ostream *poVar4;
  Am_Gesture_Classifier_Data *pAVar5;
  istream *piVar6;
  Vector pdVar7;
  Matrix ppdVar8;
  ulong uVar9;
  ulong uVar10;
  bool *pbVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  Gesture_Class *pGVar16;
  Vector *ppdVar17;
  char check;
  int n;
  Am_Gesture_Classifier_Data *local_b0;
  Gesture_Class *local_a8;
  Am_Gesture_Classifier *local_a0;
  char buf [100];
  
  local_a0 = cl;
  std::istream::get((char *)s,(long)buf,'d');
  plVar3 = (long *)std::istream::get((char *)s);
  if (((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) && (check == '\n')) {
    for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 8) {
      iVar2 = strcmp(buf,*(char **)((long)version_messages + lVar15));
      if (iVar2 == 0) {
        std::istream::operator>>((istream *)s,&n);
        std::istream::get((char *)s,(long)buf,'d');
        plVar3 = (long *)std::istream::get((char *)s);
        if ((((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) &&
            (check == '\n')) && (iVar2 = bcmp(buf," classes",9), iVar2 == 0)) {
          pAVar5 = (Am_Gesture_Classifier_Data *)operator_new(0x28);
          Am_Gesture_Classifier_Data::Am_Gesture_Classifier_Data(pAVar5,n);
          pGVar16 = pAVar5->classes;
          lVar13 = 0;
          local_b0 = pAVar5;
          local_a8 = pGVar16;
          goto LAB_001aef90;
        }
        break;
      }
    }
  }
LAB_001aef1c:
  poVar4 = std::operator<<((ostream *)&std::cerr,"unrecognized gesture classifier format");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ios::clear((int)*(undefined8 *)(*(long *)s + -0x18) + (int)s);
  return s;
LAB_001aef90:
  if (n <= lVar13) goto LAB_001aefe4;
  std::istream::get((char *)s,(long)buf);
  plVar3 = (long *)std::istream::get((char *)s);
  if (((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) || (check != '\n'))
  goto LAB_001aef1c;
  Am_String::operator=(&pGVar16->name,buf);
  lVar13 = lVar13 + 1;
  pGVar16 = pGVar16 + 1;
  goto LAB_001aef90;
LAB_001aefe4:
  piVar6 = std::operator>>(s,&check);
  if (check == 'V' && ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
    std::istream::putback((char)s);
    pGVar16 = local_a8;
    ppdVar17 = &local_a8->w;
    for (lVar13 = 0; lVar14 = (long)n, pdVar7 = InputVector(s), pAVar5 = local_b0, lVar13 < lVar14;
        lVar13 = lVar13 + 1) {
      ppdVar17[-1] = pdVar7;
      pdVar7 = InputVector(s);
      *ppdVar17 = pdVar7;
      ppdVar17 = ppdVar17 + 6;
    }
    uVar10 = 0;
    uVar9 = (ulong)(uint)n;
    if (n < 1) {
      uVar9 = uVar10;
    }
    pdVar12 = &pGVar16->cnst;
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      *pdVar12 = pdVar7[uVar10];
      pdVar12 = pdVar12 + 6;
    }
    FreeVector(pdVar7);
    if (lVar15 == 0) {
      uVar10 = 0;
      uVar9 = (ulong)(uint)n;
      if (n < 1) {
        uVar9 = uVar10;
      }
      for (; uVar9 * 0x30 - uVar10 != 0; uVar10 = uVar10 + 0x30) {
        (&pGVar16->is_dot)[uVar10] = false;
      }
    }
    else {
      pdVar7 = InputVector(s);
      uVar10 = 0;
      uVar9 = (ulong)(uint)n;
      if (n < 1) {
        uVar9 = uVar10;
      }
      pbVar11 = &pGVar16->is_dot;
      for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        *pbVar11 = pdVar7[uVar10] != 0.0;
        pbVar11 = pbVar11 + 0x30;
      }
      FreeVector(pdVar7);
    }
    ppdVar8 = InputMatrix(s);
    pAVar5->invavgcov = ppdVar8;
    pAVar5->trained = true;
  }
  else if (((byte)s[*(long *)(*(long *)s + -0x18) + 0x20] & 5) == 0) {
    std::istream::putback((char)s);
  }
  else {
    std::ios::clear((int)*(long *)(*(long *)s + -0x18) + (int)s);
  }
  pAVar1 = local_a0;
  if (((byte)s[*(long *)(*(long *)s + -0x18) + 0x20] & 5) == 0) {
    if (local_a0->data != (Am_Gesture_Classifier_Data *)0x0) {
      Am_Wrapper::Release(&local_a0->data->super_Am_Wrapper);
    }
    pAVar1->data = local_b0;
    return s;
  }
  goto LAB_001aef1c;
}

Assistant:

std::istream &
operator>>(std::istream &s, Am_Gesture_Classifier &cl)
{
  int n;
  char buf[100];
  Am_Gesture_Classifier_Data *cldata = nullptr;
  Am_Gesture_Classifier_Data::Gesture_Class *classes;
  int ver;
  int i;
  char check;

  // First check gesture version

  s.get(buf, sizeof(buf), '\n');
  if (!s.get(check) || check != '\n')
    goto lFail;

  for (ver = 0;; ++ver)
    if (!version_messages[ver])
      goto lFail;
    else if (!strcmp(buf, version_messages[ver]))
      break;

  // Classifier and trainer formats both begin with a class list.  E.g.:
  //
  //   3 classes
  //   cut
  //   copy
  //   paste

  s >> n;
  s.get(buf, sizeof(buf), '\n');

  if (!s.get(check) || check != '\n' || strcmp(buf, " classes"))
    goto lFail;

  // construct a new classifier with n classes
  cldata = new Am_Gesture_Classifier_Data(n);
  classes = cldata->classes;

  //AM_TRACE(n << " classes " <<std::flush);
  for (i = 0; i < n; i++) {
    s.get(buf, sizeof(buf));
    if (!s.get(check) || check != '\n')
      // class name too long
      goto lFail;
    classes[i].name = buf;
    //AM_TRACE(buf << " " <<std::flush);
  }
  //AM_TRACE(endl);

  // Now look for weights, constants, covariance matrix.
  // Weight vector begins with 'V'.  If we don't find it, assume
  // we have an untrained classifier (i.e., just a list of classes).

  if (s >> check && check == 'V') {
    s.putback(check);

    for (i = 0; i < n; i++) {
      classes[i].average = InputVector(s);
      classes[i].w = InputVector(s);
    }

    Vector v = InputVector(s);
    for (i = 0; i < n; i++)
      classes[i].cnst = v[i];
    FreeVector(v);

    if (ver > NO_DOT_VERSION) {
      Vector v = InputVector(s);
      // read in is_dot fields for each class
      for (i = 0; i < n; ++i)
        classes[i].is_dot = (v[i] != 0.0);
      FreeVector(v);
    } else {
      // initialize all is_dot fields
      for (i = 0; i < n; ++i)
        classes[i].is_dot = false;
    }

    cldata->invavgcov = InputMatrix(s);

    cldata->trained = true;
  } else if (s)
    s.putback(check);
  else
    s.clear(std::ios::goodbit);

  if (!s)
    goto lFail;

  if (cl.data)
    cl.data->Release();
  cl.data = cldata;
  return s;

lFail:
  std::cerr << "unrecognized gesture classifier format" << std::endl;
  s.clear(std::ios::badbit);
  return s;
}